

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O2

ngx_int_t ngx_http_charset_postconfiguration(ngx_conf_t *cf)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  ngx_http_output_header_filter_pt p_Var4;
  ngx_http_output_body_filter_pt p_Var5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long *plVar13;
  long *plVar14;
  bool bVar15;
  
  plVar1 = *(long **)(*cf->ctx + ngx_http_charset_filter_module.ctx_index * 8);
  lVar2 = *plVar1;
  plVar14 = (long *)plVar1[5];
  lVar11 = 0;
LAB_0015bd5e:
  if (lVar11 == plVar1[0xb]) {
    uVar10 = 0;
    do {
      p_Var5 = ngx_http_top_body_filter;
      p_Var4 = ngx_http_top_header_filter;
      if ((ulong)plVar1[6] <= uVar10) {
        ngx_http_top_header_filter = ngx_http_charset_header_filter;
        ngx_http_top_body_filter = ngx_http_charset_body_filter;
        ngx_http_next_header_filter = p_Var4;
        ngx_http_next_body_filter = p_Var5;
        return 0;
      }
      lVar11 = *plVar14;
      pvVar6 = *(void **)(lVar2 + lVar11 * 0x20);
      if (pvVar6 == (void *)0x0) {
        pvVar6 = ngx_pcalloc(cf->pool,plVar1[1] << 3);
        if (pvVar6 == (void *)0x0) {
          return -1;
        }
        lVar11 = *plVar14;
        *(void **)(lVar2 + lVar11 * 0x20) = pvVar6;
      }
      lVar8 = plVar14[1];
      pvVar7 = *(void **)(lVar2 + lVar8 * 0x20);
      if (pvVar7 == (void *)0x0) {
        pvVar7 = ngx_pcalloc(cf->pool,plVar1[1] << 3);
        if (pvVar7 == (void *)0x0) {
          return -1;
        }
        lVar8 = plVar14[1];
        *(void **)(lVar2 + lVar8 * 0x20) = pvVar7;
        lVar11 = *plVar14;
      }
      *(long *)((long)pvVar6 + lVar8 * 8) = plVar14[2];
      *(long *)((long)pvVar7 + lVar11 * 8) = plVar14[3];
      uVar10 = uVar10 + 1;
      plVar14 = plVar14 + 4;
    } while( true );
  }
  lVar8 = plVar1[10] + lVar11 * 0x10;
  lVar3 = *(long *)(plVar1[10] + lVar11 * 0x10);
  lVar12 = plVar1[6];
  plVar13 = plVar14 + 1;
  do {
    bVar15 = lVar12 == 0;
    lVar12 = lVar12 + -1;
    if (bVar15) {
      if (cf->log->log_level != 0) {
        ngx_log_error_core(1,cf->log,0,"no \"charset_map\" between the charsets \"%V\" and \"%V\"",
                           lVar3 * 0x20 + lVar2 + 8,lVar2 + *(long *)(lVar8 + 8) * 0x20 + 8);
        return -1;
      }
      return -1;
    }
    if (lVar3 == plVar13[-1]) {
      lVar9 = *plVar13;
      if (*(long *)(lVar8 + 8) == lVar9) break;
    }
    else {
      lVar9 = *plVar13;
    }
    if ((lVar3 == lVar9) && (*(long *)(lVar8 + 8) == plVar13[-1])) break;
    plVar13 = plVar13 + 4;
  } while( true );
  lVar11 = lVar11 + 1;
  goto LAB_0015bd5e;
}

Assistant:

static ngx_int_t
ngx_http_charset_postconfiguration(ngx_conf_t *cf)
{
    u_char                       **src, **dst;
    ngx_int_t                      c;
    ngx_uint_t                     i, t;
    ngx_http_charset_t            *charset;
    ngx_http_charset_recode_t     *recode;
    ngx_http_charset_tables_t     *tables;
    ngx_http_charset_main_conf_t  *mcf;

    mcf = ngx_http_conf_get_module_main_conf(cf,
                                             ngx_http_charset_filter_module);

    recode = mcf->recodes.elts;
    tables = mcf->tables.elts;
    charset = mcf->charsets.elts;

    for (i = 0; i < mcf->recodes.nelts; i++) {

        c = recode[i].src;

        for (t = 0; t < mcf->tables.nelts; t++) {

            if (c == tables[t].src && recode[i].dst == tables[t].dst) {
                goto next;
            }

            if (c == tables[t].dst && recode[i].dst == tables[t].src) {
                goto next;
            }
        }

        ngx_log_error(NGX_LOG_EMERG, cf->log, 0,
                   "no \"charset_map\" between the charsets \"%V\" and \"%V\"",
                   &charset[c].name, &charset[recode[i].dst].name);
        return NGX_ERROR;

    next:
        continue;
    }


    for (t = 0; t < mcf->tables.nelts; t++) {

        src = charset[tables[t].src].tables;

        if (src == NULL) {
            src = ngx_pcalloc(cf->pool, sizeof(u_char *) * mcf->charsets.nelts);
            if (src == NULL) {
                return NGX_ERROR;
            }

            charset[tables[t].src].tables = src;
        }

        dst = charset[tables[t].dst].tables;

        if (dst == NULL) {
            dst = ngx_pcalloc(cf->pool, sizeof(u_char *) * mcf->charsets.nelts);
            if (dst == NULL) {
                return NGX_ERROR;
            }

            charset[tables[t].dst].tables = dst;
        }

        src[tables[t].dst] = tables[t].src2dst;
        dst[tables[t].src] = tables[t].dst2src;
    }

    ngx_http_next_header_filter = ngx_http_top_header_filter;
    ngx_http_top_header_filter = ngx_http_charset_header_filter;

    ngx_http_next_body_filter = ngx_http_top_body_filter;
    ngx_http_top_body_filter = ngx_http_charset_body_filter;

    return NGX_OK;
}